

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O1

void __thiscall
draco::Metadata::AddEntry<std::vector<int,std::allocator<int>>>
          (Metadata *this,string *entry_name,vector<int,_std::allocator<int>_> *entry_value)

{
  iterator __position;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>
  *__args;
  EntryValue local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>
  local_58;
  
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
                       *)this,entry_name);
  if ((_Rb_tree_header *)__position._M_node != &(this->entries_)._M_t._M_impl.super__Rb_tree_header)
  {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
    ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
                    *)this,(const_iterator)__position._M_node);
  }
  EntryValue::EntryValue<int>(&local_70,entry_value);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>
  ::pair<draco::EntryValue,_true>(&local_58,entry_name,&local_70);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,draco::EntryValue>,std::_Select1st<std::pair<std::__cxx11::string_const,draco::EntryValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,draco::EntryValue>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,draco::EntryValue>>
            ((pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>,_bool>
              *)this,(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,draco::EntryValue>,std::_Select1st<std::pair<std::__cxx11::string_const,draco::EntryValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,draco::EntryValue>>>
                      *)&local_58,__args);
  if (local_58.second.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.second.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.second.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.second.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.first._M_dataplus._M_p != &local_58.first.field_2) {
    operator_delete(local_58.first._M_dataplus._M_p,local_58.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void AddEntry(const std::string &entry_name, const DataTypeT &entry_value) {
    const auto itr = entries_.find(entry_name);
    if (itr != entries_.end()) {
      entries_.erase(itr);
    }
    entries_.insert(std::make_pair(entry_name, EntryValue(entry_value)));
  }